

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O2

void __thiscall
SimpleStringInternalCache::releaseNonCachedMemory
          (SimpleStringInternalCache *this,char *memory,size_t size)

{
  UtestShell *pUVar1;
  char *pcVar2;
  SimpleStringMemoryBlock *block;
  SimpleStringMemoryBlock *pSVar3;
  SimpleStringMemoryBlock *block_00;
  SimpleString SStack_28;
  
  block_00 = this->nonCachedAllocations_;
  if ((block_00 == (SimpleStringMemoryBlock *)0x0) || (block_00->memory_ != memory)) {
    do {
      pSVar3 = block_00;
      if (pSVar3 == (SimpleStringMemoryBlock *)0x0) {
        if (this->hasWarnedAboutDeallocations == false) {
          this->hasWarnedAboutDeallocations = true;
          pUVar1 = UtestShell::getCurrent();
          StringFromFormat((char *)&SStack_28,
                           "\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\nThis is likely due statics and will cause problems.\nOnly warning once to avoid recursive warnings.\nString we are deallocating: \"%s\"\n"
                           ,memory);
          pcVar2 = SimpleString::asCharString(&SStack_28);
          (*pUVar1->_vptr_UtestShell[0x1c])
                    (pUVar1,pcVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x9e);
          SimpleString::~SimpleString(&SStack_28);
        }
        return;
      }
      block_00 = pSVar3->next_;
    } while ((block_00 == (SimpleStringMemoryBlock *)0x0) || (block_00->memory_ != memory));
    pSVar3->next_ = block_00->next_;
  }
  else {
    this->nonCachedAllocations_ = block_00->next_;
  }
  destroySimpleStringMemoryBlock(this,block_00,size);
  return;
}

Assistant:

void SimpleStringInternalCache::releaseNonCachedMemory(char* memory, size_t size)
{
    if (nonCachedAllocations_ && nonCachedAllocations_->memory_ == memory) {
        SimpleStringMemoryBlock* block = nonCachedAllocations_;
        nonCachedAllocations_ = block->next_;
        destroySimpleStringMemoryBlock(block, size);
        return;
    }

    for (SimpleStringMemoryBlock* block = nonCachedAllocations_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            destroySimpleStringMemoryBlock(blockToFree, size);
            return;
        }
    }

    printDeallocatingUnknownMemory(memory);
}